

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions_reductions.hpp
# Opt level: O2

size_type __thiscall
std::experimental::detail::
dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,3ul>
::operator()(dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,3ul>
             *this,dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                   d0)

{
  value_type vVar1;
  value_type vVar2;
  dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL> local_28;
  
  vVar1 = dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<unsigned_long>(&d0,1);
  local_28.dynamic_dims_._M_elems[2] = d0.dynamic_dims_._M_elems[2];
  local_28.dynamic_dims_._M_elems[0] = d0.dynamic_dims_._M_elems[0];
  local_28.dynamic_dims_._M_elems[1] = d0.dynamic_dims_._M_elems[1];
  vVar2 = dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<unsigned_long>(&local_28,2);
  return vVar2 * vVar1;
}

Assistant:

constexpr typename dimensions<Dims0...>::size_type operator()(
        dimensions<Dims0...> d0
        ) const noexcept
    {
        static_assert(
            std::rank<dimensions<Dims0...> >::value == Size 
          , "Size not equal to rank of argument"
        );
        return Reduction()(
            Op()(d0[Idx])
          , dims_unary_reduction<Op, Reduction, Sentinel, Idx + 1, Size>()
                (std::move(d0))
        );
    }